

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O0

void SWIG_JavaThrowException(JNIEnv *jenv,SWIG_JavaExceptionCodes code,char *msg)

{
  jclass p_Var1;
  SWIG_JavaExceptionCodes in_ESI;
  SWIG_JavaExceptions_t *except_ptr;
  jclass excep;
  jclass in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar2;
  SWIG_JavaExceptions_t *local_28;
  
  local_28 = SWIG_JavaThrowException::java_exceptions;
  while( true ) {
    uVar2 = false;
    if (local_28->code != in_ESI) {
      uVar2 = local_28->code != 0;
    }
    if ((bool)uVar2 == false) break;
    local_28 = local_28 + 1;
  }
  JNIEnv_::ExceptionClear((JNIEnv_ *)0x11aa04);
  p_Var1 = JNIEnv_::FindClass((JNIEnv_ *)CONCAT17(uVar2,in_stack_ffffffffffffffd0),
                              (char *)in_stack_ffffffffffffffc8);
  if (p_Var1 != (jclass)0x0) {
    JNIEnv_::ThrowNew((JNIEnv_ *)CONCAT17(uVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
                      ,(char *)0x11aa38);
  }
  return;
}

Assistant:

static void SWIGUNUSED SWIG_JavaThrowException(JNIEnv *jenv, SWIG_JavaExceptionCodes code, const char *msg) {
  jclass excep;
  static const SWIG_JavaExceptions_t java_exceptions[] = {
    { SWIG_JavaOutOfMemoryError, "java/lang/OutOfMemoryError" },
    { SWIG_JavaIOException, "java/io/IOException" },
    { SWIG_JavaRuntimeException, "java/lang/RuntimeException" },
    { SWIG_JavaIndexOutOfBoundsException, "java/lang/IndexOutOfBoundsException" },
    { SWIG_JavaArithmeticException, "java/lang/ArithmeticException" },
    { SWIG_JavaIllegalArgumentException, "java/lang/IllegalArgumentException" },
    { SWIG_JavaNullPointerException, "java/lang/NullPointerException" },
    { SWIG_JavaDirectorPureVirtual, "java/lang/RuntimeException" },
    { SWIG_JavaUnknownError,  "java/lang/UnknownError" },
    { (SWIG_JavaExceptionCodes)0,  "java/lang/UnknownError" }
  };
  const SWIG_JavaExceptions_t *except_ptr = java_exceptions;

  while (except_ptr->code != code && except_ptr->code)
    except_ptr++;

  jenv->ExceptionClear();
  excep = jenv->FindClass(except_ptr->java_exception);
  if (excep)
    jenv->ThrowNew(excep, msg);
}